

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::TrimCapabilitiesPass::TrimUnrequiredExtensions
          (TrimCapabilitiesPass *this,ExtensionSet *required_extensions)

{
  ExtensionSet *this_00;
  bool bVar1;
  Capability operand;
  spv_result_t sVar2;
  Extension value;
  long lVar3;
  byte bVar4;
  uint32_t i;
  ulong uVar5;
  spv_operand_desc_t *desc;
  ExtensionSet *local_a8;
  TrimCapabilitiesPass *local_a0;
  size_t local_98;
  AssemblyGrammar *local_90;
  iterator __begin2;
  iterator __begin2_1;
  ExtensionSet supported_extensions;
  
  local_90 = &((this->super_Pass).context_)->grammar_;
  local_a8 = required_extensions;
  EnumSet<spvtools::Extension>::EnumSet(&supported_extensions);
  desc = (spv_operand_desc_t *)0x0;
  EnumSet<spv::Capability>::cbegin(&__begin2,&this->supportedCapabilities_);
  local_98 = (long)(this->supportedCapabilities_).buckets_.
                   super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->supportedCapabilities_).buckets_.
                   super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_a0 = this;
  while (((__begin2.set_ != &this->supportedCapabilities_ || (__begin2.bucketOffset_ != 0)) ||
         (__begin2.bucketIndex_ != local_98))) {
    operand = EnumSet<spv::Capability>::Iterator::operator*(&__begin2);
    sVar2 = AssemblyGrammar::lookupOperand(local_90,SPV_OPERAND_TYPE_CAPABILITY,operand,&desc);
    if (sVar2 == SPV_SUCCESS) {
      lVar3 = 0;
      for (uVar5 = 0; uVar5 < desc->numExtensions; uVar5 = uVar5 + 1) {
        EnumSet<spvtools::Extension>::insert
                  ((pair<spvtools::EnumSet<spvtools::Extension>::Iterator,_bool> *)&__begin2_1,
                   &supported_extensions,(Extension *)((long)desc->extensions + lVar3));
        lVar3 = lVar3 + 4;
      }
    }
    EnumSet<spv::Capability>::Iterator::operator++(&__begin2);
  }
  EnumSet<spvtools::Extension>::cbegin(&__begin2_1,&supported_extensions);
  this_00 = local_a8;
  bVar4 = 0;
  while (((__begin2_1.set_ != &supported_extensions || (__begin2_1.bucketOffset_ != 0)) ||
         (__begin2_1.bucketIndex_ !=
          (long)supported_extensions.buckets_.
                super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)supported_extensions.buckets_.
                super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4))) {
    value = EnumSet<spvtools::Extension>::Iterator::operator*(&__begin2_1);
    bVar1 = EnumSet<spvtools::Extension>::contains(this_00,value);
    if (!bVar1) {
      bVar1 = IRContext::RemoveExtension((local_a0->super_Pass).context_,value);
      bVar4 = bVar4 | bVar1;
    }
    EnumSet<spvtools::Extension>::Iterator::operator++(&__begin2_1);
  }
  std::
  _Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ::~_Vector_base((_Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                   *)&supported_extensions);
  return bVar4 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status TrimCapabilitiesPass::TrimUnrequiredExtensions(
    const ExtensionSet& required_extensions) const {
  const auto supported_extensions =
      getExtensionsRelatedTo(supportedCapabilities_, context()->grammar());

  bool modified_module = false;
  for (auto extension : supported_extensions) {
    if (required_extensions.contains(extension)) {
      continue;
    }

    if (context()->RemoveExtension(extension)) {
      modified_module = true;
    }
  }

  return modified_module ? Pass::Status::SuccessWithChange
                         : Pass::Status::SuccessWithoutChange;
}